

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateMethods
          (EnumGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  undefined1 qualified;
  string *psVar3;
  int i_00;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *enum_value;
  EnumValueDescriptor *extraout_RDX_01;
  int i;
  long lVar5;
  int j;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  undefined1 auVar9 [16];
  allocator local_d9;
  Printer *local_d8;
  key_type local_d0;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = printer;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&numbers,"classname",(allocator *)&local_d0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&numbers);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&numbers);
  SimpleItoa_abi_cxx11_((string *)&numbers,(protobuf *)(ulong)(uint)this->index_in_metadata_,i_00);
  std::__cxx11::string::string((string *)&local_d0,"index_in_metadata",(allocator *)&local_50);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&numbers);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&numbers);
  std::__cxx11::string::string((string *)&numbers,"constexpr",(allocator *)&local_d0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&numbers);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&numbers);
  FileLevelNamespace((string *)&numbers,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  std::__cxx11::string::string((string *)&local_d0,"file_namespace",(allocator *)&local_50);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&numbers);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&numbers);
  if ((this->options_->enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(local_d8,&vars,
                       "const ::google::protobuf::EnumDescriptor* $classname$_descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_enum_descriptors[$index_in_metadata$];\n}\n"
                      );
  }
  io::Printer::Print(local_d8,&vars,"bool $classname$_IsValid(int value) {\n  switch (value) {\n");
  p_Var1 = &numbers._M_t._M_impl.super__Rb_tree_header;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  numbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0x10;
  lVar6 = 0;
  uVar4 = extraout_RDX;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while( true ) {
    auVar9._8_8_ = uVar4;
    auVar9._0_8_ = numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    psVar3 = (string *)(long)*(int *)(this->descriptor_ + 0x2c);
    if ((long)psVar3 <= lVar6) break;
    local_d0._M_dataplus._M_p._0_4_ = *(undefined4 *)(*(long *)(this->descriptor_ + 0x30) + lVar5);
    pVar8 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&numbers._M_t,(int *)&local_d0);
    uVar4 = pVar8._8_8_;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x28;
  }
  while( true ) {
    p_Var7 = auVar9._0_8_;
    qualified = SUB81(psVar3,0);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) break;
    Int32ToString_abi_cxx11_(&local_d0,(cpp *)(ulong)p_Var7[1]._M_color,auVar9._8_4_);
    psVar3 = &local_d0;
    io::Printer::Print(local_d8,"    case $number$:\n","number",&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    auVar9 = std::_Rb_tree_increment(p_Var7);
  }
  io::Printer::Print(local_d8,&vars,
                     "      return true;\n    default:\n      return false;\n  }\n}\n\n");
  if (*(long *)(this->descriptor_ + 0x18) != 0) {
    io::Printer::Print(local_d8,"#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
    ClassName_abi_cxx11_
              (&local_d0,*(cpp **)(this->descriptor_ + 0x18),(Descriptor *)0x0,(bool)qualified);
    std::__cxx11::string::string((string *)&local_50,"parent",&local_d9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"nested_name",(allocator *)&local_50);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_d0);
    lVar5 = 0;
    enum_value = extraout_RDX_00;
    for (lVar6 = 0; lVar6 < *(int *)(this->descriptor_ + 0x2c); lVar6 = lVar6 + 1) {
      EnumValueName_abi_cxx11_
                (&local_d0,(cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar5),enum_value);
      std::__cxx11::string::string((string *)&local_50,"value",&local_d9);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_50);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      io::Printer::Print(local_d8,&vars,"$constexpr$const $classname$ $parent$::$value$;\n");
      lVar5 = lVar5 + 0x28;
      enum_value = extraout_RDX_01;
    }
    io::Printer::Print(local_d8,&vars,
                       "const $classname$ $parent$::$nested_name$_MIN;\nconst $classname$ $parent$::$nested_name$_MAX;\n"
                      );
    if (this->generate_array_size_ == true) {
      io::Printer::Print(local_d8,&vars,"const int $parent$::$nested_name$_ARRAYSIZE;\n");
    }
    io::Printer::Print(local_d8,"#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n");
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&numbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateMethods(io::Printer* printer) {
  std::map<string, string> vars;
  vars["classname"] = classname_;
  vars["index_in_metadata"] = SimpleItoa(index_in_metadata_);
  vars["constexpr"] = options_.proto_h ? "constexpr " : "";
  vars["file_namespace"] = FileLevelNamespace(descriptor_->file()->name());

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
        vars,
        "const ::google::protobuf::EnumDescriptor* $classname$_descriptor() {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_enum_descriptors[$index_in_metadata$];\n"
        "}\n");
  }

  printer->Print(vars,
    "bool $classname$_IsValid(int value) {\n"
    "  switch (value) {\n");

  // Multiple values may have the same number.  Make sure we only cover
  // each number once by first constructing a set containing all valid
  // numbers, then printing a case statement for each element.

  std::set<int> numbers;
  for (int j = 0; j < descriptor_->value_count(); j++) {
    const EnumValueDescriptor* value = descriptor_->value(j);
    numbers.insert(value->number());
  }

  for (std::set<int>::iterator iter = numbers.begin();
       iter != numbers.end(); ++iter) {
    printer->Print(
      "    case $number$:\n",
      "number", Int32ToString(*iter));
  }

  printer->Print(vars,
    "      return true;\n"
    "    default:\n"
    "      return false;\n"
    "  }\n"
    "}\n"
    "\n");

  if (descriptor_->containing_type() != NULL) {
    // We need to "define" the static constants which were declared in the
    // header, to give the linker a place to put them.  Or at least the C++
    // standard says we have to.  MSVC actually insists that we do _not_ define
    // them again in the .cc file, prior to VC++ 2015.
    printer->Print("#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");

    vars["parent"] = ClassName(descriptor_->containing_type(), false);
    vars["nested_name"] = descriptor_->name();
    for (int i = 0; i < descriptor_->value_count(); i++) {
      vars["value"] = EnumValueName(descriptor_->value(i));
      printer->Print(vars,
        "$constexpr$const $classname$ $parent$::$value$;\n");
    }
    printer->Print(vars,
      "const $classname$ $parent$::$nested_name$_MIN;\n"
      "const $classname$ $parent$::$nested_name$_MAX;\n");
    if (generate_array_size_) {
      printer->Print(vars,
        "const int $parent$::$nested_name$_ARRAYSIZE;\n");
    }

    printer->Print("#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n");
  }
}